

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

float glcts::SoftLight(float s,float d)

{
  float fVar1;
  float d_local;
  float s_local;
  
  if (0.5 < s) {
    if (0.25 < d) {
      fVar1 = ::deFloatSqrt(d);
      d_local = (s + s + -1.0) * (fVar1 - d) + d;
    }
    else {
      d_local = (s + s + -1.0) * d * ((d * 16.0 + -12.0) * d + 3.0) + d;
    }
  }
  else {
    d_local = -((1.0 - (s + s)) * d) * (1.0 - d) + d;
  }
  return d_local;
}

Assistant:

static float SoftLight(float s, float d)
{
	if (s <= 0.5f)
		return d - (1.f - 2.f * s) * d * (1.f - d);
	else if (d <= 0.25f)
	{
		DE_ASSERT(s > 0.5f && d <= 0.25f);
		return d + (2.f * s - 1.f) * d * ((16.f * d - 12.f) * d + 3.f);
	}
	else
	{
		DE_ASSERT(s > 0.5f && d > 0.25f);
		return d + (2.f * s - 1.f) * (deFloatSqrt(d) - d);
	}
}